

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O2

StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>
supermap::io::
DeserializeHelper<supermap::StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>
::deserialize(istream *is)

{
  Key<2UL> KVar1;
  IOException *this;
  allocator<char> local_39;
  string local_38 [32];
  
  KVar1 = ShallowDeserializer<supermap::Key<2UL>,_void>::deserialize(is);
  std::istream::seekg((long)is,_S_end|_S_cur);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    return (Key<2UL>)(Key<2UL>)KVar1.super_array<unsigned_char,_2UL>._M_elems;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"StorageValueIgnorer deserialization fail: seekg failed",&local_39);
  supermap::IOException::IOException(this,local_38);
  __cxa_throw(this,&IOException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static StorageValueIgnorer<Key, Value> deserialize(std::istream &is) {
        StorageValueIgnorer<Key, Value> svi{io::deserialize<Key>(is)};
        is.seekg(FixedDeserializedSizeRegister<Value>::exactDeserializedSize, std::ios_base::cur);
        if (is.fail()) {
            throw IOException("StorageValueIgnorer deserialization fail: seekg failed");
        }
        return svi;
    }